

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonevector.cpp
# Opt level: O0

Error __thiscall
asmjit::v1_14::ZoneBitVector::_resize
          (ZoneBitVector *this,ZoneAllocator *allocator,uint32_t newSize,uint32_t idealCapacity,
          bool newBitsValue)

{
  void *pvVar1;
  ulong uVar2;
  byte bVar3;
  uint uVar4;
  Error EVar5;
  uint uVar6;
  uint uVar7;
  uint in_ECX;
  uint in_EDX;
  long *in_RDI;
  byte in_R8B;
  uint32_t endIdx;
  uint32_t nBits;
  BitWord pattern;
  uint32_t endBit;
  uint32_t startBit;
  uint32_t idx;
  size_t allocatedCapacityInBits;
  BitWord *newData;
  size_t allocatedCapacity;
  uint32_t minimumCapacity;
  uint32_t minimumCapacityInBits;
  BitWord *data;
  uint32_t oldSize;
  uint32_t bit;
  uint32_t idx_1;
  char *in_stack_00000340;
  int in_stack_0000034c;
  char *in_stack_00000350;
  size_t *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  void *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  uint local_8c;
  ulong local_88;
  ulong local_78;
  void *local_68;
  uint local_28;
  
  if (in_ECX < in_EDX) {
    DebugUtils::assertionFailed(in_stack_00000350,in_stack_0000034c,in_stack_00000340);
  }
  if (in_EDX <= *(uint *)(in_RDI + 1)) {
    if ((in_EDX & 0x3f) != 0) {
      *(ulong *)(*in_RDI + (ulong)(in_EDX >> 6) * 8) =
           (1L << (sbyte)(in_EDX & 0x3f)) - 1U & *(ulong *)(*in_RDI + (ulong)(in_EDX >> 6) * 8);
    }
    *(uint *)(in_RDI + 1) = in_EDX;
    return 0;
  }
  uVar6 = *(uint *)(in_RDI + 1);
  pvVar1 = (void *)*in_RDI;
  local_68 = pvVar1;
  if (*(uint *)((long)in_RDI + 0xc) < in_EDX) {
    uVar4 = in_ECX + 0x3f & 0xffffffc0;
    if (uVar4 < in_EDX) {
      EVar5 = DebugUtils::errored(1);
      return EVar5;
    }
    local_68 = ZoneAllocator::alloc
                         ((ZoneAllocator *)
                          CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                          (size_t)in_RDI,in_stack_ffffffffffffff48);
    if (local_68 == (void *)0x0) {
      EVar5 = DebugUtils::errored(1);
      return EVar5;
    }
    local_88 = local_78 << 3;
    if (local_88 < local_78) {
      local_88 = (ulong)uVar4;
    }
    for (local_28 = 0; local_28 < uVar6 + 0x3f >> 6; local_28 = local_28 + 1) {
      *(undefined8 *)((long)local_68 + (ulong)local_28 * 8) =
           *(undefined8 *)((long)pvVar1 + (ulong)local_28 * 8);
    }
    if (pvVar1 != (void *)0x0) {
      ZoneAllocator::release
                ((ZoneAllocator *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                 in_stack_ffffffffffffff60,
                 CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    }
    *in_RDI = (long)local_68;
    *(int *)((long)in_RDI + 0xc) = (int)local_88;
  }
  uVar4 = uVar6 >> 6;
  uVar6 = uVar6 & 0x3f;
  uVar7 = in_EDX & 0x3f;
  uVar2 = -(ulong)(in_R8B & 1);
  local_8c = uVar4;
  if (uVar6 != 0) {
    if (uVar4 == in_EDX >> 6) {
      if (uVar7 <= uVar6) {
        DebugUtils::assertionFailed(in_stack_00000350,in_stack_0000034c,in_stack_00000340);
      }
      bVar3 = (sbyte)uVar7 - (char)uVar6;
    }
    else {
      bVar3 = 0x40 - (char)uVar6;
    }
    local_8c = uVar4 + 1;
    *(ulong *)((long)local_68 + (ulong)uVar4 * 8) =
         uVar2 << (bVar3 & 0x3f) | *(ulong *)((long)local_68 + (ulong)uVar4 * 8);
  }
  uVar6 = in_EDX + 0x3f >> 6;
  while (local_8c < uVar6) {
    *(ulong *)((long)local_68 + (ulong)local_8c * 8) = uVar2;
    local_8c = local_8c + 1;
  }
  if (uVar7 != 0) {
    *(ulong *)((long)local_68 + (ulong)(uVar6 - 1) * 8) = uVar2 & (1L << (sbyte)uVar7) - 1U;
  }
  *(uint *)(in_RDI + 1) = in_EDX;
  return 0;
}

Assistant:

Error ZoneBitVector::_resize(ZoneAllocator* allocator, uint32_t newSize, uint32_t idealCapacity, bool newBitsValue) noexcept {
  ASMJIT_ASSERT(idealCapacity >= newSize);

  if (newSize <= _size) {
    // The size after the resize is lesser than or equal to the current size.
    uint32_t idx = newSize / kBitWordSizeInBits;
    uint32_t bit = newSize % kBitWordSizeInBits;

    // Just set all bits outside of the new size in the last word to zero.
    // There is a case that there are not bits to set if `bit` is zero. This
    // happens when `newSize` is a multiply of `kBitWordSizeInBits` like 64, 128,
    // and so on. In that case don't change anything as that would mean settings
    // bits outside of the `_size`.
    if (bit)
      _data[idx] &= (BitWord(1) << bit) - 1u;

    _size = newSize;
    return kErrorOk;
  }

  uint32_t oldSize = _size;
  BitWord* data = _data;

  if (newSize > _capacity) {
    // Realloc needed, calculate the minimum capacity (in bytes) required.
    uint32_t minimumCapacityInBits = Support::alignUp<uint32_t>(idealCapacity, kBitWordSizeInBits);

    if (ASMJIT_UNLIKELY(minimumCapacityInBits < newSize))
      return DebugUtils::errored(kErrorOutOfMemory);

    // Normalize to bytes.
    uint32_t minimumCapacity = minimumCapacityInBits / 8;
    size_t allocatedCapacity;

    BitWord* newData = static_cast<BitWord*>(allocator->alloc(minimumCapacity, allocatedCapacity));
    if (ASMJIT_UNLIKELY(!newData))
      return DebugUtils::errored(kErrorOutOfMemory);

    // `allocatedCapacity` now contains number in bytes, we need bits.
    size_t allocatedCapacityInBits = allocatedCapacity * 8;

    // Arithmetic overflow should normally not happen. If it happens we just
    // change the `allocatedCapacityInBits` to the `minimumCapacityInBits` as
    // this value is still safe to be used to call `_allocator->release(...)`.
    if (ASMJIT_UNLIKELY(allocatedCapacityInBits < allocatedCapacity))
      allocatedCapacityInBits = minimumCapacityInBits;

    _copyBits(newData, data, _wordsPerBits(oldSize));

    if (data)
      allocator->release(data, _capacity / 8);
    data = newData;

    _data = data;
    _capacity = uint32_t(allocatedCapacityInBits);
  }

  // Start (of the old size) and end (of the new size) bits
  uint32_t idx = oldSize / kBitWordSizeInBits;
  uint32_t startBit = oldSize % kBitWordSizeInBits;
  uint32_t endBit = newSize % kBitWordSizeInBits;

  // Set new bits to either 0 or 1. The `pattern` is used to set multiple
  // bits per bit-word and contains either all zeros or all ones.
  BitWord pattern = Support::bitMaskFromBool<BitWord>(newBitsValue);

  // First initialize the last bit-word of the old size.
  if (startBit) {
    uint32_t nBits = 0;

    if (idx == (newSize / kBitWordSizeInBits)) {
      // The number of bit-words is the same after the resize. In that case
      // we need to set only bits necessary in the current last bit-word.
      ASMJIT_ASSERT(startBit < endBit);
      nBits = endBit - startBit;
    }
    else {
      // There is be more bit-words after the resize. In that case we don't
      // have to be extra careful about the last bit-word of the old size.
      nBits = kBitWordSizeInBits - startBit;
    }

    data[idx++] |= pattern << nBits;
  }

  // Initialize all bit-words after the last bit-word of the old size.
  uint32_t endIdx = _wordsPerBits(newSize);
  while (idx < endIdx) data[idx++] = pattern;

  // Clear unused bits of the last bit-word.
  if (endBit)
    data[endIdx - 1] = pattern & ((BitWord(1) << endBit) - 1);

  _size = newSize;
  return kErrorOk;
}